

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O1

spv_result_t spvtools::val::IdPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  ValidationState_t *pVVar2;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  spv_result_t sVar6;
  pointer psVar7;
  Instruction *pIVar8;
  ulong extraout_RAX;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  spv_result_t unaff_EBP;
  uint32_t uVar13;
  char *pcVar14;
  Op op;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  function<bool_(unsigned_int)> can_have_forward_declared_ids;
  spv_result_t local_264;
  string local_260;
  uint local_23c;
  ValidationState_t *local_238;
  uint32_t local_22c;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  ulong uVar9;
  
  bVar3 = spvIsExtendedInstruction((uint)(inst->inst_).opcode);
  if ((bVar3) && (bVar3 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type), bVar3)) {
    uVar1 = (inst->inst_).opcode;
    uVar9 = (ulong)uVar1;
    spvDbgInfoExtOperandCanBeForwardDeclaredFunction
              ((function<bool_(unsigned_int)> *)&local_228,(uint)uVar1,(inst->inst_).ext_inst_type,
               (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[4]);
  }
  else {
    uVar1 = (inst->inst_).opcode;
    uVar9 = (ulong)uVar1;
    spvOperandCanBeForwardDeclaredFunction((function<bool_(unsigned_int)> *)&local_228,(uint)uVar1);
  }
  psVar7 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar17 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_finish == psVar7;
  bVar3 = !bVar17;
  if (bVar17) {
    uVar13 = 0;
    uVar10 = 0;
  }
  else {
    uVar15 = 0;
    uVar16 = 1;
    local_22c = 0;
    local_23c = 0;
    local_238 = _;
    do {
      if (6 < psVar7[uVar15].type - SPV_OPERAND_TYPE_ID) goto switchD_001eba75_caseD_6;
      uVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[psVar7[uVar15].offset];
      local_264 = (spv_result_t)uVar9;
      switch(psVar7[uVar15].type) {
      default:
        pIVar8 = ValidationState_t::FindDef(_,uVar13);
        if (pIVar8 == (Instruction *)0x0) {
          local_208._0_4_ = uVar16 - 1;
          if (local_218 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          bVar17 = (*local_210)(&local_228,(uint *)&local_208);
          pVVar2 = local_238;
          if (bVar17) {
            iVar5 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
            if ((iVar5 == 0) ||
               (bVar17 = ValidationState_t::IsForwardPointer(pVVar2,uVar13), bVar17)) {
              sVar6 = ValidationState_t::ForwardDeclareId(pVVar2,uVar13);
              uVar9 = (ulong)(uint)sVar6;
            }
            else {
              ValidationState_t::diag(&local_208,pVVar2,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8)
              ;
              ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar2,uVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," requires a previous definition",0x1f);
              sVar6 = local_208.error_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
              uVar9 = extraout_RAX;
            }
            uVar15 = (ulong)(uint)sVar6;
            bVar17 = true;
            local_23c = (uint)CONCAT71((int7)(uVar9 >> 8),1);
          }
          else {
            ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ID ",3);
            ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar2,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," has not been defined",0x15);
            uVar15 = (ulong)(uint)local_208.error_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar17 = true;
          }
        }
        else {
          uVar1 = (inst->inst_).opcode;
          op = (Op)uVar1;
          iVar5 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
          if (iVar5 == 0) {
LAB_001ebae3:
            if ((((pIVar8->inst_).type_id == 0) &&
                ((((iVar5 = spvOpcodeGeneratesType(op), iVar5 == 0 &&
                   (bVar17 = spvOpcodeIsDebug(op), !bVar17)) &&
                  (bVar17 = Instruction::IsDebugInfo(inst), !bVar17)) &&
                 ((bVar17 = Instruction::IsNonSemantic(inst), !bVar17 &&
                  (bVar17 = spvOpcodeIsDecoration(op), !bVar17)))))) &&
               (bVar17 = spvOpcodeIsBranch(op), !bVar17)) {
              if (uVar1 < 0xf5) {
                if ((OpFunction < op) || ((0x40000000001800U >> ((ulong)op & 0x3f) & 1) == 0))
                goto LAB_001ebfb3;
              }
              else if (op == OpSubgroupReadInvocationKHR || uVar1 < 0x1150) {
                if (2 < op - OpPhi) {
LAB_001ebfb3:
                  bVar17 = spvOpcodeGeneratesUntypedPointer(op);
                  pVVar2 = local_238;
                  if ((op != OpUntypedArrayLengthKHR && !bVar17) &&
                     ((op != OpSpecConstantOp ||
                      ((uVar10 = (inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[3], uVar10 != 0x116c &&
                       (uVar10 != 0x14f2)))))) {
                    ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Operand ",8);
                    ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar2,uVar13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_260._M_dataplus._M_p,
                               local_260._M_string_length);
                    lVar11 = 0x10;
                    pcVar14 = " requires a type";
                    goto LAB_001ec054;
                  }
                }
              }
              else if (((op != OpExtInstWithForwardRefsKHR) && (op != OpCooperativeMatrixLengthKHR))
                      && (op != OpCooperativeMatrixLengthNV)) goto LAB_001ebfb3;
            }
            bVar4 = Instruction::IsNonSemantic(pIVar8);
            uVar15 = 0;
            bVar17 = true;
            if ((!bVar4) || (bVar4 = Instruction::IsNonSemantic(inst), pVVar2 = local_238, bVar4))
            goto LAB_001ec091;
            ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8);
            ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar2,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
            lVar11 = 0x3d;
            pcVar14 = " in semantic instruction cannot be a non-semantic instruction";
          }
          else {
            iVar5 = spvOpcodeGeneratesType(op);
            if ((((((iVar5 != 0) || (bVar17 = spvOpcodeIsDebug((uint)uVar1), bVar17)) ||
                  (bVar17 = Instruction::IsDebugInfo(inst), bVar17)) ||
                 ((bVar17 = Instruction::IsNonSemantic(inst), bVar17 ||
                  (bVar17 = spvOpcodeIsDecoration(op), bVar17)))) || (op == OpFunction)) ||
               ((((op == OpCooperativeMatrixLengthKHR || (op == OpCooperativeMatrixLengthNV)) ||
                 (bVar17 = spvOpcodeGeneratesUntypedPointer(op), pVVar2 = local_238,
                 op == OpUntypedArrayLengthKHR || bVar17)) ||
                ((op == OpSpecConstantOp &&
                 ((uVar10 = (inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[3], uVar10 == 0x116c ||
                  (uVar10 == 0x14f2)))))))) goto LAB_001ebae3;
            ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8);
            ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar2,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
            lVar11 = 0x11;
            pcVar14 = " cannot be a type";
          }
LAB_001ec054:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar11);
          local_264 = local_208.error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream(&local_208);
          uVar15 = 0xffffffff;
          bVar17 = false;
        }
LAB_001ec091:
        uVar9 = (ulong)(uint)local_264;
        _ = local_238;
        if (bVar17) break;
        bVar17 = false;
        goto LAB_001ec0b2;
      case SPV_OPERAND_TYPE_TYPE_ID:
        bVar17 = ValidationState_t::IsDefinedId(_,uVar13);
        if (bVar17) {
          pIVar8 = ValidationState_t::FindDef(_,uVar13);
          iVar5 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
          if (iVar5 == 0) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ID ",3);
            ValidationState_t::getIdName_abi_cxx11_(&local_260,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
            lVar11 = 0x11;
            pcVar14 = " is not a type id";
            goto LAB_001ebde5;
          }
          uVar15 = 0;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ID ",3);
          ValidationState_t::getIdName_abi_cxx11_(&local_260,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
          lVar11 = 0x15;
          pcVar14 = " has not been defined";
LAB_001ebde5:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar11);
          uVar15 = (ulong)(uint)local_208.error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream(&local_208);
        }
        uVar9 = uVar9 & 0xffffffff;
        break;
      case SPV_OPERAND_TYPE_RESULT_ID:
        uVar15 = 0;
        local_22c = uVar13;
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        if ((inst->inst_).opcode == 0x1151) {
          bVar17 = Instruction::IsNonSemantic(inst);
          if (bVar17) {
            uVar15 = 0;
            uVar9 = uVar9 & 0xffffffff;
            break;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "OpExtInstWithForwardRefsKHR is only allowed with non-semantic instructions.",
                     0x4b);
          sVar6 = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar17 = false;
          uVar9 = (ulong)(uint)sVar6;
          goto LAB_001ec0b2;
        }
      case SPV_OPERAND_TYPE_LITERAL_INTEGER:
switchD_001eba75_caseD_6:
        uVar15 = 0;
      }
      bVar17 = (int)uVar15 == 0;
      uVar9 = uVar9 & 0xffffffff;
      if (!bVar17) {
        uVar9 = uVar15;
      }
LAB_001ec0b2:
      unaff_EBP = (spv_result_t)uVar9;
      uVar13 = local_22c;
      uVar10 = local_23c;
      if (!bVar17) break;
      uVar15 = (ulong)uVar16;
      psVar7 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
      uVar16 = uVar16 + 1;
      bVar3 = uVar15 < uVar12;
    } while (uVar15 < uVar12);
  }
  if (!bVar3) {
    if ((inst->inst_).opcode == 0x1151 && (uVar10 & 1) == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "Opcode OpExtInstWithForwardRefsKHR must have at least one forward declared ID.",
                 0x4e);
      DiagnosticStream::~DiagnosticStream(&local_208);
      unaff_EBP = local_208.error_;
    }
    else {
      unaff_EBP = SPV_SUCCESS;
      if (uVar13 != 0) {
        ValidationState_t::RemoveIfForwardDeclared(_,uVar13);
      }
    }
  }
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  return unaff_EBP;
}

Assistant:

spv_result_t IdPass(ValidationState_t& _, Instruction* inst) {
  auto can_have_forward_declared_ids =
      spvIsExtendedInstruction(inst->opcode()) &&
              spvExtInstIsDebugInfo(inst->ext_inst_type())
          ? spvDbgInfoExtOperandCanBeForwardDeclaredFunction(
                inst->opcode(), inst->ext_inst_type(), inst->word(4))
          : spvOperandCanBeForwardDeclaredFunction(inst->opcode());

  // Keep track of a result id defined by this instruction.  0 means it
  // does not define an id.
  uint32_t result_id = 0;
  bool has_forward_declared_ids = false;

  for (unsigned i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    const spv_operand_type_t& type = operand.type;
    // We only care about Id operands, which are a single word.
    const uint32_t operand_word = inst->word(operand.offset);

    auto ret = SPV_ERROR_INTERNAL;
    switch (type) {
      case SPV_OPERAND_TYPE_RESULT_ID:
        // NOTE: Multiple Id definitions are being checked by the binary parser.
        //
        // Defer undefined-forward-reference removal until after we've analyzed
        // the remaining operands to this instruction.  Deferral only matters
        // for OpPhi since it's the only case where it defines its own forward
        // reference.  Other instructions that can have forward references
        // either don't define a value or the forward reference is to a function
        // Id (and hence defined outside of a function body).
        result_id = operand_word;
        // NOTE: The result Id is added (in RegisterInstruction) *after* all of
        // the other Ids have been checked to avoid premature use in the same
        // instruction.
        ret = SPV_SUCCESS;
        break;
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID:
        if (const auto def = _.FindDef(operand_word)) {
          const auto opcode = inst->opcode();
          if (spvOpcodeGeneratesType(def->opcode()) &&
              !spvOpcodeGeneratesType(opcode) && !spvOpcodeIsDebug(opcode) &&
              !inst->IsDebugInfo() && !inst->IsNonSemantic() &&
              !spvOpcodeIsDecoration(opcode) && opcode != spv::Op::OpFunction &&
              opcode != spv::Op::OpCooperativeMatrixLengthNV &&
              opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
              !spvOpcodeGeneratesUntypedPointer(opcode) &&
              opcode != spv::Op::OpUntypedArrayLengthKHR &&
              !(opcode == spv::Op::OpSpecConstantOp &&
                (spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthNV ||
                 spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " cannot be a type";
          } else if (def->type_id() == 0 && !spvOpcodeGeneratesType(opcode) &&
                     !spvOpcodeIsDebug(opcode) && !inst->IsDebugInfo() &&
                     !inst->IsNonSemantic() && !spvOpcodeIsDecoration(opcode) &&
                     !spvOpcodeIsBranch(opcode) && opcode != spv::Op::OpPhi &&
                     opcode != spv::Op::OpExtInst &&
                     opcode != spv::Op::OpExtInstWithForwardRefsKHR &&
                     opcode != spv::Op::OpExtInstImport &&
                     opcode != spv::Op::OpSelectionMerge &&
                     opcode != spv::Op::OpLoopMerge &&
                     opcode != spv::Op::OpFunction &&
                     opcode != spv::Op::OpCooperativeMatrixLengthNV &&
                     opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
                     !spvOpcodeGeneratesUntypedPointer(opcode) &&
                     opcode != spv::Op::OpUntypedArrayLengthKHR &&
                     !(opcode == spv::Op::OpSpecConstantOp &&
                       (spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthNV ||
                        spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " requires a type";
          } else if (def->IsNonSemantic() && !inst->IsNonSemantic()) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " in semantic instruction cannot be a non-semantic "
                      "instruction";
          } else {
            ret = SPV_SUCCESS;
          }
        } else if (can_have_forward_declared_ids(i)) {
          has_forward_declared_ids = true;
          if (spvOpcodeGeneratesType(inst->opcode()) &&
              !_.IsForwardPointer(operand_word)) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "Operand " << _.getIdName(operand_word)
                  << " requires a previous definition";
          } else {
            ret = _.ForwardDeclareId(operand_word);
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_TYPE_ID:
        if (_.IsDefinedId(operand_word)) {
          auto* def = _.FindDef(operand_word);
          if (!spvOpcodeGeneratesType(def->opcode())) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "ID " << _.getIdName(operand_word) << " is not a type id";
          } else {
            ret = SPV_SUCCESS;
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        // Ideally, this check would live in validate_extensions.cpp. But since
        // forward references are only allowed on non-semantic instructions, and
        // ID validation is done first, we would fail with a "ID had not been
        // defined" error before we could give a more helpful message. For this
        // reason, this test is done here, so we can be more helpful to the
        // user.
        if (inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR &&
            !inst->IsNonSemantic())
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "OpExtInstWithForwardRefsKHR is only allowed with "
                    "non-semantic instructions.";
        ret = SPV_SUCCESS;
        break;
      default:
        ret = SPV_SUCCESS;
        break;
    }
    if (SPV_SUCCESS != ret) return ret;
  }
  const bool must_have_forward_declared_ids =
      inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR;
  if (must_have_forward_declared_ids && !has_forward_declared_ids) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Opcode OpExtInstWithForwardRefsKHR must have at least one "
              "forward "
              "declared ID.";
  }

  if (result_id) _.RemoveIfForwardDeclared(result_id);

  return SPV_SUCCESS;
}